

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O2

int __thiscall
ActionActiveReturn::clone
          (ActionActiveReturn *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  ActionActiveReturn *this_00;
  string *nm;
  
  nm = &(this->super_Action).basegroup;
  bVar1 = ActionGroupList::contains((ActionGroupList *)__fn,nm);
  if (bVar1) {
    this_00 = (ActionActiveReturn *)operator_new(0x68);
    ActionActiveReturn(this_00,nm);
  }
  else {
    this_00 = (ActionActiveReturn *)0x0;
  }
  return (int)this_00;
}

Assistant:

virtual Action *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Action *)0;
    return new ActionActiveReturn(getGroup());
  }